

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fImplementationLimitTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ImplementationLimitTests::init
          (ImplementationLimitTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  LimitQueryCase<long> *pLVar1;
  LimitQueryCase<int> *pLVar2;
  LimitQueryCase<float> *this_00;
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::FloatRange> *pLVar3;
  TestNode *pTVar4;
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::Boolean> *this_01;
  LimitQueryCase<unsigned_long> *this_02;
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::NegInt> *this_03;
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::AlignmentInt> *this_04;
  FloatRange local_28;
  int minFragmentUniformComponents;
  int minFragmentUniformBlocks;
  int minVertexUniformComponents;
  int minVertexUniformBlocks;
  
  minFragmentUniformBlocks = 0xc;
  minVertexUniformComponents = 0x400;
  minFragmentUniformComponents = 0x380;
  minVertexUniformBlocks = minFragmentUniformBlocks;
  pLVar1 = (LimitQueryCase<long> *)operator_new(0x88);
  local_28.min = 2.3509886e-38;
  local_28.max = 0.0;
  LimitQueryCase<long>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"max_element_index","GL_MAX_ELEMENT_INDEX"
             ,0x8d6b,(long *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 5.60519e-45;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"subpixel_bits","GL_SUBPIXEL_BITS",0xd50,
             (int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 3.58732e-43;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_3d_texture_size",
             "GL_MAX_3D_TEXTURE_SIZE",0x8073,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 2.86986e-42;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_texture_size","GL_MAX_TEXTURE_SIZE",
             0xd33,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 3.58732e-43;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_array_texture_layers",
             "GL_MAX_ARRAY_TEXTURE_LAYERS",0x88ff,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  this_00 = (LimitQueryCase<float> *)operator_new(0x80);
  local_28.min = 2.0;
  LimitQueryCase<float>::LimitQueryCase
            (this_00,(this->super_TestCaseGroup).m_context,"max_texture_lod_bias",
             "GL_MAX_TEXTURE_LOD_BIAS",0x84fd,&local_28.min);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 2.86986e-42;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_cube_map_texture_size",
             "GL_MAX_CUBE_MAP_TEXTURE_SIZE",0x851c,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 2.86986e-42;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_renderbuffer_size",
             "GL_MAX_RENDERBUFFER_SIZE",0x84e8,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 5.60519e-45;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_draw_buffers","GL_MAX_DRAW_BUFFERS",
             0x8824,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 5.60519e-45;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_color_attachments",
             "GL_MAX_COLOR_ATTACHMENTS",0x8cdf,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar3 = (LimitQueryCase<deqp::gles3::Functional::LimitQuery::FloatRange> *)operator_new(0x88);
  local_28.min = 1.0;
  local_28.max = 1.0;
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::FloatRange>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"aliased_point_size_range",
             "GL_ALIASED_POINT_SIZE_RANGE",0x846d,&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar3 = (LimitQueryCase<deqp::gles3::Functional::LimitQuery::FloatRange> *)operator_new(0x88);
  local_28.min = 1.0;
  local_28.max = 1.0;
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::FloatRange>::LimitQueryCase
            (pLVar3,(this->super_TestCaseGroup).m_context,"aliased_line_width_range",
             "GL_ALIASED_LINE_WIDTH_RANGE",0x846e,&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar3);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28 = (FloatRange)((ulong)local_28 & 0xffffffff00000000);
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_elements_indices",
             "GL_MAX_ELEMENTS_INDICES",0x80e9,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28 = (FloatRange)((ulong)local_28 & 0xffffffff00000000);
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_elements_vertices",
             "GL_MAX_ELEMENTS_VERTICES",33000,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 1.4013e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"num_compressed_texture_formats",
             "GL_NUM_COMPRESSED_TEXTURE_FORMATS",0x86a2,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pTVar4 = (TestNode *)operator_new(0x78);
  CompressedTextureFormatsQueryCase::CompressedTextureFormatsQueryCase
            ((CompressedTextureFormatsQueryCase *)pTVar4,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 0.0;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"num_program_binary_formats",
             "GL_NUM_PROGRAM_BINARY_FORMATS",0x87fe,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28 = (FloatRange)((ulong)(uint)local_28.max << 0x20);
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"num_shader_binary_formats",
             "GL_NUM_SHADER_BINARY_FORMATS",0x8df9,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  this_01 = (LimitQueryCase<deqp::gles3::Functional::LimitQuery::Boolean> *)operator_new(0x80);
  local_28.min._0_1_ = 1;
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::Boolean>::LimitQueryCase
            (this_01,(this->super_TestCaseGroup).m_context,"shader_compiler","GL_SHADER_COMPILER",
             0x8dfa,(Boolean *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (LimitQueryCase<unsigned_long> *)operator_new(0x88);
  local_28.min = 0.0;
  local_28.max = 0.0;
  LimitQueryCase<unsigned_long>::LimitQueryCase
            (this_02,(this->super_TestCaseGroup).m_context,"max_server_wait_timeout",
             "GL_MAX_SERVER_WAIT_TIMEOUT",0x9111,(unsigned_long *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  pTVar4 = (TestNode *)operator_new(0x78);
  ExtensionQueryCase::ExtensionQueryCase
            ((ExtensionQueryCase *)pTVar4,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28 = (FloatRange)((ulong)local_28 & 0xffffffff00000000);
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"num_extensions","GL_NUM_EXTENSIONS",
             0x821d,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 4.2039e-45;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"major_version","GL_MAJOR_VERSION",0x821b,
             (int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 0.0;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"minor_version","GL_MINOR_VERSION",0x821c,
             (int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 2.24208e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_vertex_attribs",
             "GL_MAX_VERTEX_ATTRIBS",0x8869,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_vertex_uniform_components",
             "GL_MAX_VERTEX_UNIFORM_COMPONENTS",0x8b4a,&minVertexUniformComponents);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 3.58732e-43;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_vertex_uniform_vectors",
             "GL_MAX_VERTEX_UNIFORM_VECTORS",0x8dfb,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_vertex_uniform_blocks",
             "GL_MAX_VERTEX_UNIFORM_BLOCKS",0x8a2b,&minVertexUniformBlocks);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 8.96831e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_vertex_output_components",
             "GL_MAX_VERTEX_OUTPUT_COMPONENTS",0x9122,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 2.24208e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_vertex_texture_image_units",
             "GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS",0x8b4c,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_fragment_uniform_components",
             "GL_MAX_FRAGMENT_UNIFORM_COMPONENTS",0x8b49,&minFragmentUniformComponents);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 3.13891e-43;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_fragment_uniform_vectors",
             "GL_MAX_FRAGMENT_UNIFORM_VECTORS",0x8dfd,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_fragment_uniform_blocks",
             "GL_MAX_FRAGMENT_UNIFORM_BLOCKS",0x8a2d,&minFragmentUniformBlocks);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 8.40779e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_fragment_input_components",
             "GL_MAX_FRAGMENT_INPUT_COMPONENTS",0x9125,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 2.24208e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_texture_image_units",
             "GL_MAX_TEXTURE_IMAGE_UNITS",0x8872,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  this_03 = (LimitQueryCase<deqp::gles3::Functional::LimitQuery::NegInt> *)operator_new(0x80);
  local_28.min = -NAN;
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::NegInt>::LimitQueryCase
            (this_03,(this->super_TestCaseGroup).m_context,"min_program_texel_offset",
             "GL_MIN_PROGRAM_TEXEL_OFFSET",0x8904,(NegInt *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 9.80909e-45;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_program_texel_offset",
             "GL_MAX_PROGRAM_TEXEL_OFFSET",0x8905,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 3.36312e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_uniform_buffer_bindings",
             "GL_MAX_UNIFORM_BUFFER_BINDINGS",0x8a2f,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar1 = (LimitQueryCase<long> *)operator_new(0x88);
  local_28.min = 2.29589e-41;
  local_28.max = 0.0;
  LimitQueryCase<long>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"max_uniform_block_size",
             "GL_MAX_UNIFORM_BLOCK_SIZE",0x8a30,(long *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  this_04 = (LimitQueryCase<deqp::gles3::Functional::LimitQuery::AlignmentInt> *)operator_new(0x80);
  local_28.min = 3.58732e-43;
  LimitQueryCase<deqp::gles3::Functional::LimitQuery::AlignmentInt>::LimitQueryCase
            (this_04,(this->super_TestCaseGroup).m_context,"uniform_buffer_offset_alignment",
             "GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT",0x8a34,(AlignmentInt *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 3.36312e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_combined_uniform_blocks",
             "GL_MAX_COMBINED_UNIFORM_BLOCKS",0x8a2e,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar1 = (LimitQueryCase<long> *)operator_new(0x88);
  local_28.min = 7.03116e-41;
  local_28.max = 0.0;
  LimitQueryCase<long>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"max_combined_vertex_uniform_components",
             "GL_MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS",0x8a31,(long *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LimitQueryCase<long> *)operator_new(0x88);
  local_28.min = 7.01322e-41;
  local_28.max = 0.0;
  LimitQueryCase<long>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"max_combined_fragment_uniform_components"
             ,"GL_MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS",0x8a33,(long *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 8.40779e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_varying_components",
             "GL_MAX_VARYING_COMPONENTS",0x8b4b,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 2.10195e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_varying_vectors",
             "GL_MAX_VARYING_VECTORS",0x8dfc,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 4.48416e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_combined_texture_image_units",
             "GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS",0x8b4d,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 8.96831e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,
             "max_transform_feedback_interleaved_components",
             "GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS",0x8c8a,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 5.60519e-45;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"max_transform_feedback_separate_attribs",
             "GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS",0x8c8b,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<int> *)operator_new(0x80);
  local_28.min = 5.60519e-45;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,
             "max_transform_feedback_separate_components",
             "GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS",0x8c80,(int *)&local_28);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  return extraout_EAX;
}

Assistant:

void ImplementationLimitTests::init (void)
{
	const int	minVertexUniformBlocks					= 12;
	const int	minVertexUniformComponents				= 1024;

	const int	minFragmentUniformBlocks				= 12;
	const int	minFragmentUniformComponents			= 896;

	const int	minUniformBlockSize						= 16384;
	const int	minCombinedVertexUniformComponents		= (minVertexUniformBlocks*minUniformBlockSize)/4 + minVertexUniformComponents;
	const int	minCombinedFragmentUniformComponents	= (minFragmentUniformBlocks*minUniformBlockSize)/4 + minFragmentUniformComponents;

#define LIMIT_CASE(NAME, PARAM, TYPE, MIN_VAL)	\
	addChild(new LimitQueryCase<TYPE>(m_context, #NAME, #PARAM, PARAM, MIN_VAL))

	LIMIT_CASE(max_element_index,				GL_MAX_ELEMENT_INDEX,					GLint64,	(1<<24)-1);
	LIMIT_CASE(subpixel_bits,					GL_SUBPIXEL_BITS,						GLint,		4);
	LIMIT_CASE(max_3d_texture_size,				GL_MAX_3D_TEXTURE_SIZE,					GLint,		256);
	LIMIT_CASE(max_texture_size,				GL_MAX_TEXTURE_SIZE,					GLint,		2048);
	LIMIT_CASE(max_array_texture_layers,		GL_MAX_ARRAY_TEXTURE_LAYERS,			GLint,		256);
	LIMIT_CASE(max_texture_lod_bias,			GL_MAX_TEXTURE_LOD_BIAS,				GLfloat,	2.0f);
	LIMIT_CASE(max_cube_map_texture_size,		GL_MAX_CUBE_MAP_TEXTURE_SIZE,			GLint,		2048);
	LIMIT_CASE(max_renderbuffer_size,			GL_MAX_RENDERBUFFER_SIZE,				GLint,		2048);
	LIMIT_CASE(max_draw_buffers,				GL_MAX_DRAW_BUFFERS,					GLint,		4);
	LIMIT_CASE(max_color_attachments,			GL_MAX_COLOR_ATTACHMENTS,				GLint,		4);
	// GL_MAX_VIEWPORT_DIMS
	LIMIT_CASE(aliased_point_size_range,		GL_ALIASED_POINT_SIZE_RANGE,			FloatRange,	FloatRange(1,1));
	LIMIT_CASE(aliased_line_width_range,		GL_ALIASED_LINE_WIDTH_RANGE,			FloatRange,	FloatRange(1,1));
	LIMIT_CASE(max_elements_indices,			GL_MAX_ELEMENTS_INDICES,				GLint,		0);
	LIMIT_CASE(max_elements_vertices,			GL_MAX_ELEMENTS_VERTICES,				GLint,		0);
	LIMIT_CASE(num_compressed_texture_formats,	GL_NUM_COMPRESSED_TEXTURE_FORMATS,		GLint,		DE_LENGTH_OF_ARRAY(s_requiredCompressedTexFormats));
	addChild(new CompressedTextureFormatsQueryCase(m_context)); // GL_COMPRESSED_TEXTURE_FORMATS
	// GL_PROGRAM_BINARY_FORMATS
	LIMIT_CASE(num_program_binary_formats,		GL_NUM_PROGRAM_BINARY_FORMATS,			GLint,		0);
	// GL_SHADER_BINARY_FORMATS
	LIMIT_CASE(num_shader_binary_formats,		GL_NUM_SHADER_BINARY_FORMATS,			GLint,		0);
	LIMIT_CASE(shader_compiler,					GL_SHADER_COMPILER,						Boolean,	GL_TRUE);
	// Shader data type ranges & precisions
	LIMIT_CASE(max_server_wait_timeout,			GL_MAX_SERVER_WAIT_TIMEOUT,				GLuint64,	0);

	// Version and extension support
	addChild(new ExtensionQueryCase(m_context)); // GL_EXTENSIONS + consistency validation
	LIMIT_CASE(num_extensions,					GL_NUM_EXTENSIONS,						GLint,		0);
	LIMIT_CASE(major_version,					GL_MAJOR_VERSION,						GLint,		3);
	LIMIT_CASE(minor_version,					GL_MINOR_VERSION,						GLint,		0);
	// GL_RENDERER
	// GL_SHADING_LANGUAGE_VERSION
	// GL_VENDOR
	// GL_VERSION

	// Vertex shader limits
	LIMIT_CASE(max_vertex_attribs,				GL_MAX_VERTEX_ATTRIBS,					GLint,		16);
	LIMIT_CASE(max_vertex_uniform_components,	GL_MAX_VERTEX_UNIFORM_COMPONENTS,		GLint,		minVertexUniformComponents);
	LIMIT_CASE(max_vertex_uniform_vectors,		GL_MAX_VERTEX_UNIFORM_VECTORS,			GLint,		minVertexUniformComponents/4);
	LIMIT_CASE(max_vertex_uniform_blocks,		GL_MAX_VERTEX_UNIFORM_BLOCKS,			GLint,		minVertexUniformBlocks);
	LIMIT_CASE(max_vertex_output_components,	GL_MAX_VERTEX_OUTPUT_COMPONENTS,		GLint,		64);
	LIMIT_CASE(max_vertex_texture_image_units,	GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS,		GLint,		16);

	// Fragment shader limits
	LIMIT_CASE(max_fragment_uniform_components,	GL_MAX_FRAGMENT_UNIFORM_COMPONENTS,		GLint,		minFragmentUniformComponents);
	LIMIT_CASE(max_fragment_uniform_vectors,	GL_MAX_FRAGMENT_UNIFORM_VECTORS,		GLint,		minFragmentUniformComponents/4);
	LIMIT_CASE(max_fragment_uniform_blocks,		GL_MAX_FRAGMENT_UNIFORM_BLOCKS,			GLint,		minFragmentUniformBlocks);
	LIMIT_CASE(max_fragment_input_components,	GL_MAX_FRAGMENT_INPUT_COMPONENTS,		GLint,		60);
	LIMIT_CASE(max_texture_image_units,			GL_MAX_TEXTURE_IMAGE_UNITS,				GLint,		16);
	LIMIT_CASE(min_program_texel_offset,		GL_MIN_PROGRAM_TEXEL_OFFSET,			NegInt,		-8);
	LIMIT_CASE(max_program_texel_offset,		GL_MAX_PROGRAM_TEXEL_OFFSET,			GLint,		7);

	// Aggregate shader limits
	LIMIT_CASE(max_uniform_buffer_bindings,						GL_MAX_UNIFORM_BUFFER_BINDINGS,						GLint,				24);
	LIMIT_CASE(max_uniform_block_size,							GL_MAX_UNIFORM_BLOCK_SIZE,							GLint64,			minUniformBlockSize);
	LIMIT_CASE(uniform_buffer_offset_alignment,					GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT,					AlignmentInt,		256);
	LIMIT_CASE(max_combined_uniform_blocks,						GL_MAX_COMBINED_UNIFORM_BLOCKS,						GLint,				24);
	LIMIT_CASE(max_combined_vertex_uniform_components,			GL_MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS,			GLint64,			minCombinedVertexUniformComponents);
	LIMIT_CASE(max_combined_fragment_uniform_components,		GL_MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS,		GLint64,			minCombinedFragmentUniformComponents);
	LIMIT_CASE(max_varying_components,							GL_MAX_VARYING_COMPONENTS,							GLint,				60);
	LIMIT_CASE(max_varying_vectors,								GL_MAX_VARYING_VECTORS,								GLint,				15);
	LIMIT_CASE(max_combined_texture_image_units,				GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,				GLint,				32);

	// Transform feedback limits
	LIMIT_CASE(max_transform_feedback_interleaved_components,	GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS,	GLint,				64);
	LIMIT_CASE(max_transform_feedback_separate_attribs,			GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS,			GLint,				4);
	LIMIT_CASE(max_transform_feedback_separate_components,		GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS,		GLint,				4);
}